

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O0

void cppurses::detail::Screen::paint_resize_event(Widget *widg,Screen_descriptor *staged_tiles)

{
  Const_reference CVar1;
  bool bVar2;
  Screen_state *pSVar3;
  Screen_mask *this;
  mapped_type *pmVar4;
  Point PVar5;
  Area AVar6;
  Glyph local_b8;
  undefined1 local_a0 [8];
  Point point;
  size_t x;
  size_t y;
  size_t x_end;
  size_t local_60;
  size_t y_end;
  size_t x_begin;
  size_t local_30;
  size_t y_begin;
  Screen_mask *new_space;
  Screen_descriptor *staged_tiles_local;
  Widget *widg_local;
  
  paint_empty_tiles(widg);
  cover_leftovers(widg,staged_tiles);
  pSVar3 = Widget::screen_state(widg);
  this = &(pSVar3->optimize).resize_mask;
  PVar5 = Screen_mask::offset(this);
  local_30 = PVar5.y;
  PVar5 = Screen_mask::offset(this);
  y_end = PVar5.x;
  AVar6 = Screen_mask::area(this);
  local_60 = AVar6.height;
  AVar6 = Screen_mask::area(this);
  y = AVar6.width;
  for (x = local_30; x < local_30 + local_60; x = x + 1) {
    for (point.y = y_end; point.y < y_end + y; point.y = point.y + 1) {
      local_a0 = (undefined1  [8])point.y;
      point.x = x;
      CVar1 = Screen_mask::at(this,point.y,x);
      if (CVar1) {
        full_paint_single_point(widg,staged_tiles,(Point *)local_a0);
      }
      else {
        bVar2 = (anonymous_namespace)::
                contains<std::unordered_map<cppurses::Point,cppurses::Glyph,std::hash<cppurses::Point>,std::equal_to<cppurses::Point>,std::allocator<std::pair<cppurses::Point_const,cppurses::Glyph>>>>
                          ((key_type *)local_a0,staged_tiles);
        if (bVar2) {
          pmVar4 = std::
                   unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>
                   ::at(staged_tiles,(key_type *)local_a0);
          Glyph::Glyph(&local_b8,pmVar4);
          basic_paint_single_point(widg,(key_type *)local_a0,&local_b8);
          Glyph::~Glyph(&local_b8);
        }
      }
    }
  }
  return;
}

Assistant:

void Screen::paint_resize_event(Widget& widg,
                                const Screen_descriptor& staged_tiles)
{
    paint_empty_tiles(widg);
    cover_leftovers(widg, staged_tiles);
    const auto& new_space = widg.screen_state().optimize.resize_mask;
    const auto y_begin    = new_space.offset().y;
    const auto x_begin    = new_space.offset().x;
    const auto y_end      = y_begin + new_space.area().height;
    const auto x_end      = x_begin + new_space.area().width;
    for (auto y = y_begin; y < y_end; ++y) {
        for (auto x = x_begin; x < x_end; ++x) {
            const Point point{x, y};
            if (new_space.at(x, y)) {
                full_paint_single_point(widg, staged_tiles, point);
            }
            else if (contains(point, staged_tiles)) {
                basic_paint_single_point(widg, point, staged_tiles.at(point));
            }
        }
    }
}